

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O1

string * __thiscall
duckdb_apache::thrift::
to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::ColumnChunk_const*,std::vector<duckdb_parquet::ColumnChunk,std::allocator<duckdb_parquet::ColumnChunk>>>>
          (string *__return_storage_ptr__,thrift *this,
          __normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
          *beg,__normal_iterator<const_duckdb_parquet::ColumnChunk_*,_std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>_>
               *end)

{
  ColumnChunk *t;
  ostringstream o;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  t = *(ColumnChunk **)this;
  if (beg->_M_current != t) {
    do {
      if (t != *(ColumnChunk **)this) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      to_string<duckdb_parquet::ColumnChunk>(&local_1c8,t);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      t = t + 1;
    } while (t != beg->_M_current);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}